

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc_combis.c
# Opt level: O1

void prefix_sum(void *a,void *a0,void *xs,bsc_size_t size)

{
  int iVar1;
  int *zero;
  ulong uVar2;
  
  if (0 < size >> 2) {
    iVar1 = *a0;
    uVar2 = 0;
    do {
      iVar1 = iVar1 + *(int *)((long)xs + uVar2 * 4);
      *(int *)((long)a + uVar2 * 4) = iVar1;
      uVar2 = uVar2 + 1;
    } while ((uint)(size >> 2) != uVar2);
  }
  return;
}

Assistant:

void prefix_sum( void * a, const void * a0, const void * xs, bsc_size_t size )
{
    int * result = a;
    const int * zero = a0;
    const int * nums = xs;
    int i, n = size/sizeof(int);
    int accu = *zero;

    for ( i = 0; i < n ; ++i ) {
        accu += nums[i];
        result[i] = accu;
    }
}